

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O2

char * __thiscall google::protobuf::internal::MicroString::LargeRep::owned_head(LargeRep *this)

{
  Nullable<const_char_*> failure_msg;
  LargeRepKind local_1c;
  LogMessageFatal local_18;
  
  local_18.super_LogMessage.errno_saver_.saved_errno_ = this->capacity;
  local_1c = kOwned;
  failure_msg = absl::lts_20250127::log_internal::
                Check_GEImpl<unsigned_int,google::protobuf::internal::MicroString::LargeRepKind>
                          ((uint *)&local_18,&local_1c,"capacity >= kOwned");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return (char *)(this + 1);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
             ,0x4d,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

char* owned_head() {
      ABSL_DCHECK_GE(capacity, kOwned);
      return reinterpret_cast<char*>(this + 1);
    }